

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_initCStream_srcSize(ZSTD_CStream *zcs,int compressionLevel,unsigned_long_long pss)

{
  size_t sVar1;
  unsigned_long_long uVar2;
  int iVar3;
  int iVar4;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = 0;
  ZSTD_clearAllDicts(zcs);
  zcs->cdict = (ZSTD_CDict *)0x0;
  if (zcs->streamStage == zcss_init) {
    uVar2 = pss + 1;
    if (pss == 0) {
      uVar2 = 0;
    }
    zcs->pledgedSrcSizePlusOne = uVar2;
    sVar1 = 0;
  }
  else {
    zcs->cParamsChanged = 1;
    sVar1 = 0xffffffffffffffc4;
  }
  iVar3 = -0x20000;
  if (-0x20000 < compressionLevel) {
    iVar3 = compressionLevel;
  }
  iVar4 = 0x16;
  if (iVar3 < 0x16) {
    iVar4 = iVar3;
  }
  if (0xfffdffe8 < compressionLevel - 0x17U) {
    iVar4 = compressionLevel;
  }
  iVar3 = 3;
  if (iVar4 != 0) {
    iVar3 = iVar4;
  }
  (zcs->requestedParams).compressionLevel = iVar3;
  return sVar1;
}

Assistant:

size_t ZSTD_initCStream_srcSize(ZSTD_CStream* zcs, int compressionLevel, unsigned long long pss)
{
    /* temporary : 0 interpreted as "unknown" during transition period.
     * Users willing to specify "unknown" **must** use ZSTD_CONTENTSIZE_UNKNOWN.
     * 0 will be interpreted as "empty" in the future.
     */
    U64 const pledgedSrcSize = (pss==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_srcSize");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    return 0;
}